

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_bind.c
# Opt level: O0

int mpt_library_bind(mpt_libsymbol *sym,char *conf,char *path,mpt_logger *out)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *err_1;
  char *err;
  int ret;
  char *libname;
  mpt_libsymbol next;
  mpt_logger *out_local;
  char *path_local;
  char *conf_local;
  mpt_libsymbol *sym_local;
  
  next.type = (mpt_type_t)out;
  memset(&libname,0,0x18);
  err._4_4_ = 0;
  if (conf == (char *)0x0) {
    if (next.type != 0) {
      msg((mpt_logger *)next.type,"mpt_library_bind",3,"%s","missing initializer target");
    }
    return -1;
  }
  pcVar2 = strchr(conf,0x40);
  if (pcVar2 != (char *)0x0) {
    err._4_4_ = 1;
    libname = (char *)mpt_library_open(pcVar2 + 1,path);
    if ((mpt_libhandle *)libname == (mpt_libhandle *)0x0) {
      if ((next.type != 0) && (lVar3 = dlerror(), lVar3 != 0)) {
        iVar1 = 4;
        if (path != (char *)0x0) {
          iVar1 = 3;
        }
        msg((mpt_logger *)next.type,"mpt_library_bind",iVar1,"%s",lVar3);
      }
      if (path == (char *)0x0) {
        return -2;
      }
      libname = (char *)mpt_library_open(pcVar2 + 1,(char *)0x0);
      if ((mpt_libhandle *)libname == (mpt_libhandle *)0x0) {
        if ((next.type != 0) && (lVar3 = dlerror(), lVar3 != 0)) {
          msg((mpt_logger *)next.type,"mpt_library_bind",3,"%s",lVar3);
        }
        return -2;
      }
      err._4_4_ = 2;
    }
  }
  iVar1 = mpt_library_symbol((mpt_libsymbol *)&libname,conf);
  if (iVar1 < 0) {
    if ((next.type != 0) && (lVar3 = dlerror(), lVar3 != 0)) {
      msg((mpt_logger *)next.type,"mpt_library_bind",3,"%s",lVar3);
    }
    sym_local._4_4_ = mpt_library_detach((mpt_libhandle **)&libname);
    if (sym_local._4_4_ < 0) {
      if (next.type == 0) {
        abort();
      }
      lVar3 = dlerror();
      if (lVar3 != 0) {
        msg((mpt_logger *)next.type,"mpt_library_bind",1,"%s",lVar3);
      }
    }
    else {
      sym_local._4_4_ = -2;
    }
  }
  else {
    mpt_library_detach(&sym->lib);
    sym->lib = (mpt_libhandle *)libname;
    sym->addr = next.lib;
    sym->type = (mpt_type_t)next.addr;
    sym_local._4_4_ = err._4_4_;
  }
  return sym_local._4_4_;
}

Assistant:

extern int mpt_library_bind(MPT_STRUCT(libsymbol) *sym, const char *conf, const char *path, MPT_INTERFACE(logger) *out)
{
	MPT_STRUCT(libsymbol) next = MPT_LIBSYMBOL_INIT;
	const char *libname;
	int ret = 0;
	
	if (!conf) {
		if (out) {
			msg(out, __func__, MPT_LOG(Error), "%s", MPT_tr("missing initializer target"));
		}
		return MPT_ERROR(BadArgument);
	}
	if ((libname = strchr(conf, '@'))) {
		ret = 1;
		++libname;
		/* load from special or default location */
		if (!(next.lib = mpt_library_open(libname, path))) {
			const char *err;
			if (out && (err = dlerror())) {
				ret = path ? MPT_LOG(Error) : MPT_LOG(Warning);
				msg(out, __func__, ret, "%s", err);
			}
			if (!path) {
				return MPT_ERROR(BadValue);
			}
			/* fallback to default library locations */
			if (!(next.lib = mpt_library_open(libname, 0))) {
				if (out && (err = dlerror())) {
					msg(out, __func__, MPT_LOG(Error), "%s", err);
				}
				return MPT_ERROR(BadValue);
			}
			ret = 2;
		}
	}
	if (mpt_library_symbol(&next, conf) < 0) {
		const char *err;
		if (out && (err = dlerror())) {
			msg(out, __func__, MPT_LOG(Error), "%s", err);
		}
		if ((ret = mpt_library_detach(&next.lib)) < 0) {
			if (!out) {
				abort();
			}
			if ((err = dlerror())) {
				msg(out, __func__, MPT_LOG(Fatal), "%s", err);
			}
			return ret;
		}
		return MPT_ERROR(BadValue);
	}
	mpt_library_detach(&sym->lib);
	
	*sym = next;
	
	return ret;
}